

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

word Shr_ManComputeTruth6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Wrd_t *vTruths)

{
  int iVar1;
  word wVar2;
  int local_2c;
  int iLeaf;
  int i;
  Vec_Wrd_t *vTruths_local;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                  ,0x152,
                  "word Shr_ManComputeTruth6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)");
  }
  Gia_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Vec_IntSize(vLeaves), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vLeaves,local_2c);
    Gia_ObjSetTravIdCurrentId(p,iVar1);
    Vec_WrdWriteEntry(vTruths,iVar1,Truth[local_2c]);
  }
  iVar1 = Gia_ObjId(p,pObj);
  wVar2 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
  return wVar2;
}

Assistant:

word Shr_ManComputeTruth6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Wrd_t * vTruths )
{
    int i, iLeaf;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vLeaves, iLeaf, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iLeaf );
        Vec_WrdWriteEntry( vTruths, iLeaf, Truth[i] );
    }
    return Shr_ManComputeTruth6_rec( p, Gia_ObjId(p, pObj), vTruths );
}